

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryRead
          (BlockedWrite *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  void *pvVar3;
  size_t extraout_RDX;
  size_t minBytes_00;
  size_t in_R8;
  PromiseArena *unaff_R12;
  PromiseArena *pPVar4;
  TransformPromiseNodeBase *this_00;
  undefined1 local_50 [40];
  
  tryReadImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
               *)local_50,(BlockedWrite *)buffer,(void *)minBytes,maxBytes,in_R8);
  minBytes_00 = local_50._8_8_;
  pPVar4 = (PromiseArena *)local_50._32_8_;
  if ((local_50._0_4_ != 2) &&
     (local_50._16_8_ = maxBytes, minBytes_00 = extraout_RDX, pPVar4 = unaff_R12,
     local_50._0_4_ == 1)) {
    minBytes_00 = local_50._8_8_;
  }
  if (local_50._0_4_ == 2) {
    AsyncPipe::tryRead((AsyncPipe *)local_50,*(void **)((long)buffer + 0x18),minBytes_00,
                       local_50._16_8_);
    uVar2 = local_50._0_8_;
    pPVar1 = *(PromiseArena **)(local_50._0_8_ + 8);
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_50._0_8_ - (long)pPVar1) < 0x28) {
      pvVar3 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_50,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:497:21)>
                 ::anon_class_8_1_54a3980e_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00622698;
      *(PromiseArena **)((long)pvVar3 + 0x3f8) = pPVar4;
      *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
    }
    else {
      *(PromiseArena **)(local_50._0_8_ + 8) = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_50._0_8_ + -0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_50,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:497:21)>
                 ::anon_class_8_1_54a3980e_for_func::operator());
      *(undefined ***)(uVar2 + -0x28) = &PTR_destroy_00622698;
      *(PromiseArena **)(uVar2 + -8) = pPVar4;
      ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    uVar2 = local_50._0_8_;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)this_00;
    if ((PromiseArenaMember *)local_50._0_8_ != (PromiseArenaMember *)0x0) {
      local_50._0_8_ = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
  }
  else {
    if (local_50._0_4_ != 1) {
      kj::_::unreachable();
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
              ((PromiseDisposer *)this,(unsigned_long *)local_50);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
      KJ_SWITCH_ONEOF(tryReadImpl(buffer, minBytes, maxBytes)) {
        KJ_CASE_ONEOF(done, Done) {
          return done.result;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          return pipe.tryRead(retry.buffer, retry.minBytes, retry.maxBytes)
              .then([n = retry.alreadyRead](size_t amount) { return amount + n; });
        }
      }
      KJ_UNREACHABLE;
    }